

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O0

bool __thiscall SQClass::GetConstructor(SQClass *this,SQObjectPtr *ctor)

{
  SQClassMember *obj;
  bool bVar1;
  SQObjectPtr *ctor_local;
  SQClass *this_local;
  
  bVar1 = this->_constructoridx != -1;
  if (bVar1) {
    obj = sqvector<SQClassMember>::operator[](&this->_methods,this->_constructoridx);
    ::SQObjectPtr::operator=(ctor,&obj->val);
  }
  return bVar1;
}

Assistant:

bool GetConstructor(SQObjectPtr &ctor)
    {
        if(_constructoridx != -1) {
            ctor = _methods[_constructoridx].val;
            return true;
        }
        return false;
    }